

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O2

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,IndexAccessor *accessor,void *data)

{
  int line;
  uint uVar1;
  int end_register;
  Function *this_00;
  SyntaxTree *pSVar2;
  uint uVar3;
  uint uVar4;
  uint local_54;
  
  line = accessor->line_;
  uVar1 = *data;
  end_register = *(int *)((long)data + 4);
  this_00 = this->current_function_->function_;
  if (accessor->semantic_ == SemanticOp_Write) {
    if (uVar1 + 1 != end_register) {
      __assert_fail("register_id + 1 == end_register",
                    "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                    ,0x298,
                    "void luna::CodeGenerateVisitor::AccessTableField(TableAccessorType *, void *, int, const LoadKey &) [TableAccessorType = luna::IndexAccessor, LoadKey = (lambda at /workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1587:26)]"
                   );
    }
    uVar4 = GenerateRegisterId(this);
    uVar3 = GenerateRegisterId(this);
    local_54 = 0x24000000;
  }
  else {
    if (accessor->semantic_ != SemanticOp_Read) {
      __assert_fail("accessor->semantic_ == SemanticOp_Write",
                    "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                    ,0x297,
                    "void luna::CodeGenerateVisitor::AccessTableField(TableAccessorType *, void *, int, const LoadKey &) [TableAccessorType = luna::IndexAccessor, LoadKey = (lambda at /workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1587:26)]"
                   );
    }
    if (end_register <= (int)uVar1 && end_register != -1) {
      return;
    }
    uVar3 = uVar1 + 1;
    if (end_register <= (int)uVar3 || end_register == -1) {
      uVar3 = GenerateRegisterId(this);
    }
    local_54 = 0x25000000;
    uVar4 = uVar1;
  }
  pSVar2 = (accessor->table_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,this);
  pSVar2 = (accessor->index_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,this);
  Function::AddInstruction
            (this_00,(Instruction)
                     (uVar1 & 0xff | (uVar3 & 0xff) << 8 | local_54 | (uVar4 & 0xff) << 0x10),line);
  if (accessor->semantic_ == SemanticOp_Read) {
    FillRemainRegisterNil(this,uVar1 + 1,end_register,line);
  }
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(IndexAccessor *accessor, void *data)
    {
        AccessTableField(accessor, data, accessor->line_,
                         [=](int key_register) {
                             ExpVarData data{ key_register, key_register + 1 };
                             accessor->index_->Accept(this, &data);
                         });
    }